

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

Mock * __thiscall Model<Mock>::save(Model<Mock> *this)

{
  long lVar1;
  Mock *pMVar2;
  pair<int,_Mock> local_20;
  
  lVar1 = __dynamic_cast(this,&typeinfo,&Mock::typeinfo,0);
  if (lVar1 != 0) {
    local_20.first = this->id;
    local_20.second.super_Model<Mock>.id = *(int *)(lVar1 + 8);
    local_20.second.super_Model<Mock>._vptr_Model = (_func_int **)&PTR_save_00137fd0;
    std::
    _Rb_tree<int,std::pair<int_const,Mock>,std::_Select1st<std::pair<int_const,Mock>>,std::less<int>,std::allocator<std::pair<int_const,Mock>>>
    ::_M_emplace_unique<std::pair<int,Mock>>
              ((_Rb_tree<int,std::pair<int_const,Mock>,std::_Select1st<std::pair<int_const,Mock>>,std::less<int>,std::allocator<std::pair<int_const,Mock>>>
                *)&objectList,&local_20);
    pMVar2 = (Mock *)__dynamic_cast(this,&typeinfo,&Mock::typeinfo,0);
    if (pMVar2 != (Mock *)0x0) {
      return pMVar2;
    }
  }
  __cxa_bad_cast();
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}